

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>::
ConvertFromStruct(JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>
                  *this,vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                        *list)

{
  bool bVar1;
  value_type *in_RDI;
  DecodeRawTransactionTxIn object;
  DecodeRawTransactionTxInStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> *__range3;
  DecodeRawTransactionTxInStruct *in_stack_fffffffffffffe88;
  DecodeRawTransactionTxIn *in_stack_fffffffffffffe90;
  vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
  *in_stack_fffffffffffffea0;
  DecodeRawTransactionTxIn *in_stack_fffffffffffffee0;
  __normal_iterator<const_DecodeRawTransactionTxInStruct_*,_std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (DecodeRawTransactionTxInStruct *)
       ::std::
       vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>::
       begin(in_stack_fffffffffffffe88);
  ::std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>::
  end((vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> *)
      in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_DecodeRawTransactionTxInStruct_*,_std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>_>
                        *)in_stack_fffffffffffffe90,
                       (__normal_iterator<const_DecodeRawTransactionTxInStruct_*,_std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>_>
                        *)in_stack_fffffffffffffe88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_DecodeRawTransactionTxInStruct_*,_std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>_>
    ::operator*(local_20);
    in_stack_fffffffffffffe90 = (DecodeRawTransactionTxIn *)&stack0xfffffffffffffeb0;
    cfd::api::json::DecodeRawTransactionTxIn::DecodeRawTransactionTxIn(in_stack_fffffffffffffee0);
    cfd::api::json::DecodeRawTransactionTxIn::ConvertFromStruct
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    ::std::
    vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
    ::push_back(in_stack_fffffffffffffea0,in_RDI);
    cfd::api::json::DecodeRawTransactionTxIn::~DecodeRawTransactionTxIn(in_stack_fffffffffffffe90);
    __gnu_cxx::
    __normal_iterator<const_DecodeRawTransactionTxInStruct_*,_std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }